

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * offsetFromAbbreviation(QString *__return_storage_ptr__,QString *text)

{
  char16_t *pcVar1;
  bool bVar2;
  QString *pQVar3;
  long n;
  long in_FS_OFFSET;
  QLatin1StringView needle;
  QLatin1StringView needle_00;
  QStringView haystack;
  QStringView haystack_00;
  QStringBuilder<QStringView_&,_QLatin1String> local_50;
  QStringView local_38;
  QString *local_28;
  
  local_28 = *(QString **)(in_FS_OFFSET + 0x28);
  pcVar1 = (text->d).ptr;
  n = (text->d).size;
  needle.m_data = "UTC";
  needle.m_size = 3;
  haystack.m_data = pcVar1;
  haystack.m_size = n;
  local_38.m_size = n;
  local_38.m_data = pcVar1;
  bVar2 = QtPrivate::startsWith(haystack,needle,CaseSensitive);
  if (bVar2) {
LAB_0030f893:
    local_38.m_data = pcVar1 + 3;
    n = n + -3;
    local_38.m_size = n;
  }
  else {
    needle_00.m_data = "GMT";
    needle_00.m_size = 3;
    haystack_00.m_data = pcVar1;
    haystack_00.m_size = n;
    bVar2 = QtPrivate::startsWith(haystack_00,needle_00,CaseSensitive);
    if (bVar2) goto LAB_0030f893;
  }
  if (n == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"+00:00";
    (__return_storage_ptr__->d).size = 6;
  }
  else {
    if (3 < n) {
      if (*(QString **)(in_FS_OFFSET + 0x28) == local_28) {
        pQVar3 = QString::right(__return_storage_ptr__,text,n);
        return pQVar3;
      }
      goto LAB_0030f939;
    }
    local_50.a = &local_38;
    local_50.b.m_size = 3;
    local_50.b.m_data = ":00";
    QStringBuilder<QStringView_&,_QLatin1String>::convertTo<QString>
              (__return_storage_ptr__,&local_50);
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_28) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
LAB_0030f939:
  __stack_chk_fail();
}

Assistant:

static QString offsetFromAbbreviation(QString &&text)
{
    QStringView tail{text};
    // May need to strip a prefix:
    if (tail.startsWith("UTC"_L1) || tail.startsWith("GMT"_L1))
        tail = tail.sliced(3);
    // TODO: there may be a locale-specific alternative prefix.
    // Hard to know without zone-name L10n details, though.
    return (tail.isEmpty() // The Qt::UTC case omits the zero offset:
            ? u"+00:00"_s
            // Whole-hour offsets may lack the zero minutes:
            : (tail.size() <= 3
               ? tail + ":00"_L1
               : std::move(text).right(tail.size())));
}